

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Save2(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint local_30;
  int fArea;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"ah");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        pAbc_local._4_4_ = 1;
      }
      else {
        iVar1 = Gia_ManHasMapping(pAbc->pGia);
        if (iVar1 == 0) {
          Abc_Print(-1,"GIA has no mapping.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar1 = Gia_ManCompareWithBest
                            (pAbc->pGiaBest2,pAbc->pGia,&pAbc->nBestLuts2,&pAbc->nBestEdges2,
                             &pAbc->nBestLevels2,local_30);
          if (iVar1 == 0) {
            pAbc_local._4_4_ = 0;
          }
          else {
            Gia_ManStopP(&pAbc->pGiaBest2);
            pGVar2 = Gia_ManDupWithAttributes(pAbc->pGia);
            pAbc->pGiaBest2 = pGVar2;
            pAbc_local._4_4_ = 0;
          }
        }
      }
      return pAbc_local._4_4_;
    }
    if (iVar1 != 0x61) break;
    local_30 = local_30 ^ 1;
  }
  Abc_Print(-2,"usage: &save2 [-ah]\n");
  Abc_Print(-2,"\t        compares and possibly saves AIG with mapping\n");
  pcVar3 = "no";
  if (local_30 != 0) {
    pcVar3 = "yes";
  }
  Abc_Print(-2,"\t-a    : toggle using area as the primary metric [default = %s]\n",pcVar3);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9Save2( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fArea = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fArea ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "GIA has no mapping.\n" );
        return 1;
    }
    if ( !Gia_ManCompareWithBest( pAbc->pGiaBest2, pAbc->pGia, &pAbc->nBestLuts2, &pAbc->nBestEdges2, &pAbc->nBestLevels2, fArea ) )
        return 0;
    // save the design as best
    Gia_ManStopP( &pAbc->pGiaBest2 );
    pAbc->pGiaBest2 = Gia_ManDupWithAttributes( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &save2 [-ah]\n" );
    Abc_Print( -2, "\t        compares and possibly saves AIG with mapping\n" );
    Abc_Print( -2, "\t-a    : toggle using area as the primary metric [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}